

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O1

int Abc_SopGetPhase(char *pSop)

{
  byte bVar1;
  long lVar2;
  char *pCur;
  char *pcVar3;
  
  lVar2 = -0x200000000;
  for (pcVar3 = pSop; *pcVar3 != '\0'; pcVar3 = pcVar3 + 1) {
    if (*pcVar3 == '\n') {
      lVar2 = lVar2 >> 0x20;
      goto LAB_001f596a;
    }
    lVar2 = lVar2 + 0x100000000;
  }
  lVar2 = -1;
LAB_001f596a:
  bVar1 = pSop[lVar2 + 1];
  if (bVar1 < 0x6e) {
    if (bVar1 == 0x30) {
      return 0;
    }
    if (bVar1 != 0x31) {
LAB_001f5980:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcSop.c"
                    ,0x233,"int Abc_SopGetPhase(char *)");
    }
  }
  else {
    if (bVar1 == 0x6e) {
      return 0;
    }
    if (bVar1 != 0x78) goto LAB_001f5980;
  }
  return 1;
}

Assistant:

int Abc_SopGetPhase( char * pSop )
{
    int nVars = Abc_SopGetVarNum( pSop );
    if ( pSop[nVars+1] == '0' || pSop[nVars+1] == 'n' )
        return 0;
    if ( pSop[nVars+1] == '1' || pSop[nVars+1] == 'x' )
        return 1;
    assert( 0 );
    return -1;
}